

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>::
     Combine<duckdb::ArgMinMaxState<short,double>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>>
               (ArgMinMaxState<short,_double> *source,ArgMinMaxState<short,_double> *target,
               AggregateInputData *param_3)

{
  bool bVar1;
  
  if (((source->super_ArgMinMaxStateBase).is_initialized == true) &&
     (((target->super_ArgMinMaxStateBase).is_initialized != true ||
      (bVar1 = GreaterThan::Operation<double>(&source->value,&target->value), bVar1)))) {
    bVar1 = (source->super_ArgMinMaxStateBase).arg_null;
    (target->super_ArgMinMaxStateBase).arg_null = bVar1;
    if (bVar1 == false) {
      target->arg = source->arg;
    }
    target->value = source->value;
    (target->super_ArgMinMaxStateBase).is_initialized = true;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_initialized) {
			return;
		}
		if (!target.is_initialized || COMPARATOR::Operation(source.value, target.value)) {
			Assign(target, source.arg, source.value, source.arg_null);
			target.is_initialized = true;
		}
	}